

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeTestCases(JUnitTestOutput *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  long *in_RDI;
  SimpleString buf;
  JUnitTestCaseResultNode *cur;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  undefined1 local_38 [16];
  char local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_RDI[4] + 0x38);
  while (local_18 != 0) {
    pcVar4 = SimpleString::asCharString((SimpleString *)0x1775de);
    bVar2 = SimpleString::isEmpty((SimpleString *)0x1775f8);
    pcVar9 = ".";
    if (bVar2) {
      pcVar9 = "";
    }
    pcVar5 = SimpleString::asCharString((SimpleString *)0x177627);
    pcVar6 = SimpleString::asCharString((SimpleString *)0x177639);
    iVar3 = *(int *)(local_18 + 0x40) - *(int *)(in_RDI[4] + 0x10);
    uVar1 = *(ulong *)(local_18 + 0x10);
    iVar8 = (int)(uVar1 / 1000);
    pcVar7 = SimpleString::asCharString((SimpleString *)0x177699);
    StringFromFormat(local_28,
                     "<testcase classname=\"%s%s%s\" name=\"%s\" assertions=\"%d\" time=\"%d.%03d\" file=\"%s\" line=\"%d\">\n"
                     ,pcVar4,pcVar9,pcVar5,pcVar6,iVar3,iVar8,(int)uVar1 + iVar8 * -1000,pcVar7,
                     *(undefined4 *)(local_18 + 0x38));
    SimpleString::asCharString((SimpleString *)0x177700);
    SimpleString::SimpleString
              ((SimpleString *)CONCAT44(in_stack_ffffffffffffff24,iVar8),
               (char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
    (**(code **)(*in_RDI + 0xd0))(in_RDI,local_38);
    SimpleString::~SimpleString((SimpleString *)0x177743);
    *(undefined8 *)(in_RDI[4] + 0x10) = *(undefined8 *)(local_18 + 0x40);
    if (*(long *)(local_18 + 0x18) == 0) {
      if ((*(byte *)(local_18 + 0x20) & 1) != 0) {
        SimpleString::SimpleString
                  ((SimpleString *)CONCAT44(in_stack_ffffffffffffff24,iVar8),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
        (**(code **)(*in_RDI + 0xd0))(in_RDI,local_58);
        SimpleString::~SimpleString((SimpleString *)0x177816);
      }
    }
    else {
      (**(code **)(*in_RDI + 0x110))(in_RDI,local_18);
    }
    SimpleString::SimpleString
              ((SimpleString *)CONCAT44(in_stack_ffffffffffffff24,iVar8),
               (char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
    (**(code **)(*in_RDI + 0xd0))(in_RDI,local_68);
    SimpleString::~SimpleString((SimpleString *)0x17787e);
    local_18 = *(long *)(local_18 + 0x48);
    SimpleString::~SimpleString((SimpleString *)0x17789f);
  }
  return;
}

Assistant:

void JUnitTestOutput::writeTestCases()
{
    JUnitTestCaseResultNode* cur = impl_->results_.head_;

    while (cur) {
        SimpleString buf = StringFromFormat(
                "<testcase classname=\"%s%s%s\" name=\"%s\" assertions=\"%d\" time=\"%d.%03d\" file=\"%s\" line=\"%d\">\n",
                impl_->package_.asCharString(),
                impl_->package_.isEmpty() ? "" : ".",
                impl_->results_.group_.asCharString(),
                cur->name_.asCharString(),
                (int) (cur->checkCount_ - impl_->results_.totalCheckCount_),
                (int) (cur->execTime_ / 1000), (int)(cur->execTime_ % 1000),
                cur->file_.asCharString(),
                (int) cur->lineNumber_);
        writeToFile(buf.asCharString());

        impl_->results_.totalCheckCount_ = cur->checkCount_;

        if (cur->failure_) {
            writeFailure(cur);
        }
        else if (cur->ignored_) {
            writeToFile("<skipped />\n");
        }
        writeToFile("</testcase>\n");
        cur = cur->next_;
    }
}